

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_opp(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  undefined8 *in_RDI;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x17;
  uint64_t x16;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x15;
  uint64_t x14;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x13;
  uint64_t x12;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x11;
  uint64_t x10;
  uint64_t x9;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x8;
  uint64_t x7;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x6;
  uint64_t x5;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x4;
  uint64_t x3;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x2;
  uint64_t x1;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_91;
  uint64_t local_90;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_81;
  uint64_t local_80;
  undefined7 in_stack_ffffffffffffff88;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_ffffffffffffff8f;
  uint64_t in_stack_ffffffffffffff90;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_ffffffffffffff9f;
  uint64_t *in_stack_ffffffffffffffa0;
  ulong local_58;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_49;
  uint64_t local_48;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_39;
  uint64_t local_38;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_29;
  uint64_t local_28;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_19;
  uint64_t local_18;
  uint64_t *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&local_18,&local_19,'\0',0,*in_RSI);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_28,&local_29,local_19,0,local_10[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_38,&local_39,local_29,0,local_10[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_48,&local_49,local_39,0,local_10[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90,
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            ((uint64_t *)&stack0xffffffffffffffa0,&stack0xffffffffffffff9f,'\0',local_18,
             local_58 & 0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            ((uint64_t *)&stack0xffffffffffffff90,&stack0xffffffffffffff8f,in_stack_ffffffffffffff9f
             ,local_28,local_58 & 0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_80,&local_81,in_stack_ffffffffffffff8f,local_38,local_58 & 0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_90,&local_91,local_81,local_48,local_58 & 0x9b9f605f5a858107);
  *local_8 = in_stack_ffffffffffffffa0;
  local_8[1] = in_stack_ffffffffffffff90;
  local_8[2] = local_80;
  local_8[3] = local_90;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_opp(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x2;
    uint64_t x3;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x4;
    uint64_t x5;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x6;
    uint64_t x7;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x8;
    uint64_t x9;
    uint64_t x10;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x11;
    uint64_t x12;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x13;
    uint64_t x14;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x15;
    uint64_t x16;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x17;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x1, &x2, 0x0,
                                                               0x0, (arg1[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x3, &x4, x2,
                                                               0x0, (arg1[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x5, &x6, x4,
                                                               0x0, (arg1[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x7, &x8, x6,
                                                               0x0, (arg1[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(
        &x9, x8, 0x0, UINT64_C(0xffffffffffffffff));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x10, &x11, 0x0, x1, (x9 & UINT64_C(0x7998f7b9022d759b)));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x12, &x13, x11, x3, (x9 & UINT64_C(0xcf846e86789051d3)));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x14, &x15, x13, x5, (x9 & UINT64_C(0xab1ec85e6b41c8aa)));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x16, &x17, x15, x7, (x9 & UINT64_C(0x9b9f605f5a858107)));
    out1[0] = x10;
    out1[1] = x12;
    out1[2] = x14;
    out1[3] = x16;
}